

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O3

handle pybind11::detail::
       eigen_array_cast<pybind11::detail::EigenProps<Eigen::Matrix<double,1,5,1,1,5>>>
                 (Type *src,handle base,bool writeable)

{
  array aVar1;
  array a;
  allocator_type local_69;
  array local_68;
  long local_60;
  StridesContainer local_58;
  long local_40;
  ShapeContainer local_38;
  array local_20;
  
  array::array(&local_68);
  local_40 = 5;
  std::vector<long,std::allocator<long>>::vector<long_const*,void>
            ((vector<long,std::allocator<long>> *)&local_38,&local_40,(long *)&local_38,
             (allocator_type *)&local_60);
  local_60 = 8;
  std::vector<long,std::allocator<long>>::vector<long_const*,void>
            ((vector<long,std::allocator<long>> *)&local_58,&local_60,(long *)&local_58,&local_69);
  array::array<double>(&local_20,&local_38,&local_58,(double *)src,base);
  object::operator=((object *)&local_68,(object *)&local_20);
  object::~object((object *)&local_20);
  if (local_58.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_38.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  aVar1.super_buffer.super_object.super_handle.m_ptr =
       local_68.super_buffer.super_object.super_handle.m_ptr;
  if (!writeable) {
    *(byte *)((long)local_68.super_buffer.super_object.super_handle.m_ptr + 0x41) =
         *(byte *)((long)local_68.super_buffer.super_object.super_handle.m_ptr + 0x41) & 0xfb;
  }
  local_68.super_buffer.super_object.super_handle.m_ptr = (buffer)(object)0x0;
  object::~object((object *)&local_68);
  return (handle)(PyObject *)aVar1.super_buffer.super_object.super_handle.m_ptr;
}

Assistant:

handle eigen_array_cast(typename props::Type const &src, handle base = handle(), bool writeable = true) {
    constexpr ssize_t elem_size = sizeof(typename props::Scalar);
    array a;
    if (props::vector)
        a = array({ src.size() }, { elem_size * src.innerStride() }, src.data(), base);
    else
        a = array({ src.rows(), src.cols() }, { elem_size * src.rowStride(), elem_size * src.colStride() },
                  src.data(), base);

    if (!writeable)
        array_proxy(a.ptr())->flags &= ~detail::npy_api::NPY_ARRAY_WRITEABLE_;

    return a.release();
}